

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_cmp_key_str_test(btree_kv_ops *kv_ops,int i)

{
  btree_cmp_func *pbVar1;
  int iVar2;
  btree_kv_ops *__ptr;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 auStack_80 [3];
  undefined1 local_68 [8];
  timeval __test_begin;
  void *local_50;
  undefined8 local_30;
  void *tmp;
  
  __ptr = (btree_kv_ops *)0x0;
  gettimeofday((timeval *)local_68,(__timezone_ptr_t)0x0);
  memleak_start();
  if (i == 1) {
    __ptr = btree_kv_get_kb32_vb64((btree_kv_ops *)0x0);
  }
  else if (i == 0) {
    __ptr = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  }
  local_30 = 0;
  pcVar3 = local_68;
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    pcVar4 = pcVar3 + -0x10;
    (&__test_begin.tv_usec)[uVar5] = (__suseconds_t)pcVar4;
    pcVar3[-0x18] = -0x28;
    pcVar3[-0x17] = '4';
    pcVar3[-0x16] = '\x10';
    pcVar3[-0x15] = '\0';
    pcVar3[-0x14] = '\0';
    pcVar3[-0x13] = '\0';
    pcVar3[-0x12] = '\0';
    pcVar3[-0x11] = '\0';
    sprintf(pcVar4,"key%d",uVar5 & 0xffffffff);
    pcVar3 = pcVar4;
  }
  pbVar1 = kv_ops->cmp;
  pcVar3[-8] = -0x13;
  pcVar3[-7] = '4';
  pcVar3[-6] = '\x10';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)((void *)__test_begin.tv_usec,(void *)__test_begin.tv_usec,(void *)0x0);
  if (iVar2 != 0) {
    builtin_strncpy(pcVar3 + -8,"\"6\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x330);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    builtin_strncpy(pcVar3 + -8,"D6\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x330,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = __ptr->cmp;
  pcVar3[-8] = '\0';
  pcVar3[-7] = '5';
  pcVar3[-6] = '\x10';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)((void *)__test_begin.tv_usec,(void *)__test_begin.tv_usec,(void *)0x0);
  if (iVar2 != 0) {
    builtin_strncpy(pcVar3 + -8,"k6\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x332);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    pcVar3[-8] = -0x73;
    pcVar3[-7] = '6';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x332,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = kv_ops->cmp;
  builtin_strncpy(pcVar3 + -8,"\x185\x10",4);
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)((void *)__test_begin.tv_usec,local_50,(void *)0x0);
  if (iVar2 == 0) {
    pcVar3[-8] = -0x4c;
    pcVar3[-7] = '6';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x336);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    pcVar3[-8] = -0x2a;
    pcVar3[-7] = '6';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x336,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = __ptr->cmp;
  builtin_strncpy(pcVar3 + -8,"+5\x10",4);
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)((void *)__test_begin.tv_usec,local_50,(void *)0x0);
  if (iVar2 == 0) {
    pcVar3[-8] = -3;
    pcVar3[-7] = '6';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x338);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    builtin_strncpy(pcVar3 + -8,"\x1f7\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x338,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = kv_ops->cmp;
  builtin_strncpy(pcVar3 + -8,"@5\x10",4);
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)(&local_30,(void *)__test_begin.tv_usec,(void *)0x0);
  if (iVar2 == 0) {
    builtin_strncpy(pcVar3 + -8,"F7\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x33c);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    builtin_strncpy(pcVar3 + -8,"h7\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x33c,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = __ptr->cmp;
  builtin_strncpy(pcVar3 + -8,"T5\x10",4);
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)(&local_30,(void *)__test_begin.tv_usec,(void *)0x0);
  if (iVar2 == 0) {
    pcVar3[-8] = -0x71;
    pcVar3[-7] = '7';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x33e);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    pcVar3[-8] = -0x4f;
    pcVar3[-7] = '7';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x33e,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = kv_ops->cmp;
  builtin_strncpy(pcVar3 + -8,"j5\x10",4);
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)(&__test_begin.tv_usec,&local_30,(void *)0x0);
  if (iVar2 == 0) {
    pcVar3[-8] = -0x28;
    pcVar3[-7] = '7';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x342);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    pcVar3[-8] = -6;
    pcVar3[-7] = '7';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x342,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = __ptr->cmp;
  builtin_strncpy(pcVar3 + -8,"\x7f5\x10",4);
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)(&__test_begin.tv_usec,&local_30,(void *)0x0);
  if (iVar2 == 0) {
    builtin_strncpy(pcVar3 + -8,"!8\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x344);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    builtin_strncpy(pcVar3 + -8,"C8\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x344,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = kv_ops->cmp;
  pcVar3[-8] = -0x6c;
  pcVar3[-7] = '5';
  pcVar3[-6] = '\x10';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)(&local_30,&local_30,(void *)0x0);
  if (iVar2 != 0) {
    builtin_strncpy(pcVar3 + -8,"j8\x10",4);
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x348);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    pcVar3[-8] = -0x74;
    pcVar3[-7] = '8';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x348,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pbVar1 = __ptr->cmp;
  pcVar3[-8] = -0x58;
  pcVar3[-7] = '5';
  pcVar3[-6] = '\x10';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  iVar2 = (*pbVar1)(&local_30,&local_30,(void *)0x0);
  if (iVar2 != 0) {
    pcVar3[-8] = -0x4d;
    pcVar3[-7] = '8';
    pcVar3[-6] = '\x10';
    pcVar3[-5] = '\0';
    pcVar3[-4] = '\0';
    pcVar3[-3] = '\0';
    pcVar3[-2] = '\0';
    pcVar3[-1] = '\0';
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x34a);
    kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass = 1;
    *(code **)(pcVar3 + -8) = kv_bid_to_value_to_bid_test;
    __assert_fail("cmp == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x34a,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
  }
  pcVar3[-8] = -0x48;
  pcVar3[-7] = '5';
  pcVar3[-6] = '\x10';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  free(__ptr);
  pcVar3[-8] = -0x43;
  pcVar3[-7] = '5';
  pcVar3[-6] = '\x10';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  memleak_end();
  pcVar4 = "%s PASSED\n";
  if (kv_cmp_key_str_test(btree_kv_ops*,int)::__test_pass != '\0') {
    pcVar4 = "%s FAILED\n";
  }
  pcVar3[-8] = -0x12;
  pcVar3[-7] = '5';
  pcVar3[-6] = '\x10';
  pcVar3[-5] = '\0';
  pcVar3[-4] = '\0';
  pcVar3[-3] = '\0';
  pcVar3[-2] = '\0';
  pcVar3[-1] = '\0';
  fprintf(_stderr,pcVar4,"kv_cmp_key_str_test");
  return;
}

Assistant:

void kv_cmp_key_str_test(btree_kv_ops *kv_ops, int i)
{

    TEST_INIT();
    memleak_start();

    idx_t idx;
    int cmp;
    int n = 4;
    char **keys = alca(char*, n);
    void *tmp;
    btree_kv_ops *kv_ops2 = NULL;

    if (i == 0){
        kv_ops2 = btree_kv_get_kb64_vb64(NULL);
    }
    if (i == 1){
        kv_ops2 =  btree_kv_get_kb32_vb64(NULL);

    }

    tmp = NULL;

    for (idx = 0; idx < n; idx ++){
        keys[idx] = alca(char, 8);
        sprintf(keys[idx], "key%d", idx);
    }

    // compare strings equal length equal values
    cmp = kv_ops->cmp(keys[0], keys[0], NULL);
    TEST_CHK( cmp == 0 );
    cmp = kv_ops2->cmp(keys[0], keys[0], NULL);
    TEST_CHK( cmp == 0 );

    // compare strings equal length diff values
    cmp = kv_ops->cmp(keys[0], keys[1], NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(keys[0], keys[1], NULL);
    TEST_CHK( cmp != 0 );

    // key1 is NULL
    cmp = kv_ops->cmp(&tmp, keys[0], NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(&tmp, keys[0], NULL);
    TEST_CHK( cmp != 0 );

    // key2 is NULL
    cmp = kv_ops->cmp(&keys[0], &tmp, NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(&keys[0], &tmp, NULL);
    TEST_CHK( cmp != 0 );

    // key1 and key2 are NULL
    cmp = kv_ops->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );
    cmp = kv_ops2->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );

    free(kv_ops2);
    memleak_end();
    TEST_RESULT("kv_cmp_key_str_test");
}